

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O0

void __thiscall
amrex::EB2::Level::fillEdgeCent(Level *this,Array<MultiFab_*,_3> *a_edgecent,Geometry *geom)

{
  BATType BVar1;
  bool bVar2;
  const_reference ppMVar3;
  BoxArray *this_00;
  Level *in_RDI;
  Periodicity PVar4;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Box *ibox;
  pair<int,_amrex::Box> *is;
  iterator __end7;
  iterator __begin7;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *__range7;
  IntVect *iv;
  const_iterator __end6;
  const_iterator __begin6;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *__range6;
  Box *bx;
  Array4<double> *fab;
  MFIter mfi;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  BoxArray *covered_edge_grids;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *pshifts;
  MultiFab *edgecent;
  int idim_1;
  int idim;
  int in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffc20;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffc2c;
  BoxArray *in_stack_fffffffffffffc30;
  undefined1 *in_stack_fffffffffffffc38;
  undefined1 *in_stack_fffffffffffffc40;
  FabArrayBase *fabarray_;
  Geometry *in_stack_fffffffffffffc50;
  Box *bx_00;
  int in_stack_fffffffffffffc78;
  BATType in_stack_fffffffffffffc7c;
  int in_stack_fffffffffffffc80;
  int iVar6;
  CpOp in_stack_fffffffffffffc84;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffc88;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffc9c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffca8;
  CpOp in_stack_fffffffffffffcb0;
  undefined1 local_33c [72];
  undefined1 local_2f4 [28];
  reference local_2d8;
  IntVect *local_2d0;
  __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
  local_2c8;
  FabArrayBase *local_2c0;
  undefined1 local_2b4 [28];
  undefined1 *local_298;
  long local_290 [8];
  long *local_250;
  MFIter local_248;
  undefined1 local_1e8 [44];
  uint local_1bc;
  undefined1 local_1b8 [104];
  undefined1 *local_150;
  IntVect local_148;
  undefined8 local_138;
  int local_130;
  undefined1 local_128 [104];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  CpOp local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  BATType local_a4;
  int iStack_a0;
  CpOp local_9c;
  FabArray<amrex::FArrayBox> *local_98;
  uint local_90;
  BoxArray *local_88;
  int local_80;
  int iStack_7c;
  uint local_78;
  CpOp local_74;
  int local_70;
  BATType local_6c;
  long *local_68;
  int local_5c;
  RefID local_58;
  undefined4 local_4c;
  undefined1 *local_48;
  undefined4 local_3c;
  IntVect *local_38;
  undefined4 local_2c;
  BoxArray *local_28;
  undefined4 local_1c;
  BoxArray *local_18;
  undefined4 local_c;
  BoxArray *local_8;
  
  for (local_128._76_4_ = 0; (int)local_128._76_4_ < 3; local_128._76_4_ = local_128._76_4_ + 1) {
    std::array<amrex::MultiFab_*,_3UL>::operator[]
              ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffc20,
               CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffc20,
               (value_type)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  }
  bVar2 = isAllRegular(in_RDI);
  if (!bVar2) {
    for (local_128._72_4_ = 0; (int)local_128._72_4_ < 3; local_128._72_4_ = local_128._72_4_ + 1) {
      ppMVar3 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                          ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffc20,
                           CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      local_128._64_8_ = *ppMVar3;
      ppMVar3 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                          ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffc20,
                           CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      bx_00 = (Box *)*ppMVar3;
      this_00 = (BoxArray *)
                std::array<amrex::MultiFab,_3UL>::operator[]
                          ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffffc20,
                           CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      FabArrayBase::nComp((FabArrayBase *)local_128._64_8_);
      in_stack_fffffffffffffc18 = FabArrayBase::nGrow((FabArrayBase *)local_128._64_8_,0);
      local_128._32_12_ = (undefined1  [12])Geometry::periodicity(in_stack_fffffffffffffc50);
      local_128._52_8_ = local_128._32_8_;
      local_128._60_4_ = local_128._40_4_;
      in_stack_fffffffffffffc20 = (FabArray<amrex::FArrayBox> *)(local_128 + 0x34);
      uVar5 = 0;
      FabArray<amrex::FArrayBox>::ParallelCopy
                (in_stack_fffffffffffffc88,
                 (FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                 in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78,(int)((ulong)in_RDI >> 0x20),
                 (int)in_RDI,(int)((ulong)in_stack_fffffffffffffc9c >> 0x20),
                 (Periodicity *)in_stack_fffffffffffffca8,in_stack_fffffffffffffcb0);
      bVar2 = BoxArray::empty((BoxArray *)0x11fce99);
      if (!bVar2) {
        PVar4 = Geometry::periodicity(in_stack_fffffffffffffc50);
        local_148.vect[2] = PVar4.period.vect[2];
        local_130 = local_148.vect[2];
        local_148.vect._0_8_ = PVar4.period.vect._0_8_;
        local_138._0_4_ = local_148.vect[0];
        local_138._4_4_ = local_148.vect[1];
        fabarray_ = (FabArrayBase *)local_128;
        local_148 = PVar4.period.vect;
        Periodicity::shiftIntVect
                  ((Periodicity *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        in_stack_fffffffffffffc50 = (Geometry *)&in_RDI->m_covered_grids;
        local_128._24_8_ = fabarray_;
        local_1bc = (uint)FabArrayBase::ixType
                                    ((FabArrayBase *)
                                     CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
        convert(in_stack_fffffffffffffc30,
                (IndexType)(uint)((ulong)in_stack_fffffffffffffc38 >> 0x20));
        local_150 = local_1b8;
        std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
        vector((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               0x11fcf5e);
        MFIter::MFIter((MFIter *)in_stack_fffffffffffffc50,fabarray_,
                       (uchar)((ulong)in_stack_fffffffffffffc40 >> 0x38));
        while (bVar2 = MFIter::isValid(&local_248), bVar2) {
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)CONCAT44(in_stack_fffffffffffffc2c,uVar5),
                     (MFIter *)in_stack_fffffffffffffc20);
          local_250 = local_290;
          MFIter::fabbox((MFIter *)in_stack_fffffffffffffc30);
          local_298 = local_2b4;
          local_2c0 = (FabArrayBase *)local_128._24_8_;
          local_2c8._M_current =
               (IntVect *)
               std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::begin
                         ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
          local_2d0 = (IntVect *)
                      std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::end
                                ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                                 CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                                     *)in_stack_fffffffffffffc20,
                                    (__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18)
                                   ), bVar2) {
            local_2d8 = __gnu_cxx::
                        __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                        ::operator*(&local_2c8);
            in_stack_fffffffffffffc40 = local_2f4;
            in_stack_fffffffffffffc38 = local_150;
            Box::operator+((Box *)in_stack_fffffffffffffc20,
                           (IntVect *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18))
            ;
            BoxArray::intersections
                      (this_00,bx_00,
                       (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        *)in_stack_fffffffffffffc50);
            local_33c._60_8_ = local_1e8;
            local_33c._52_8_ =
                 std::
                 vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                 begin((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
            local_33c._44_8_ =
                 std::
                 vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                 end((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
            while (bVar2 = __gnu_cxx::operator!=
                                     ((__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                       *)in_stack_fffffffffffffc20,
                                      (__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                       *)CONCAT44(in_stack_fffffffffffffc1c,
                                                  in_stack_fffffffffffffc18)), bVar2) {
              local_33c._36_8_ =
                   __gnu_cxx::
                   __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                   ::operator*((__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                *)(local_33c + 0x34));
              in_stack_fffffffffffffc30 = (BoxArray *)local_33c;
              Box::operator-((Box *)in_stack_fffffffffffffc20,
                             (IntVect *)
                             CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
              local_c = 0;
              local_a4 = (in_stack_fffffffffffffc30->m_bat).m_bat_type;
              local_1c = 1;
              iStack_a0 = *(int *)&(in_stack_fffffffffffffc30->m_bat).m_op;
              in_stack_fffffffffffffca8 =
                   *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                    &in_stack_fffffffffffffc30->m_bat;
              local_2c = 2;
              in_stack_fffffffffffffcb0 =
                   *(CpOp *)((long)&(in_stack_fffffffffffffc30->m_bat).m_op + 4);
              local_38 = &(in_stack_fffffffffffffc30->m_bat).m_op.m_bndryReg.m_crse_ratio;
              local_3c._0_1_ = false;
              local_3c._1_3_ = 0;
              local_80 = local_38->vect[0];
              local_48 = (undefined1 *)((long)&(in_stack_fffffffffffffc30->m_bat).m_op + 8);
              local_4c = 1;
              iStack_7c = (in_stack_fffffffffffffc30->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[1];
              in_stack_fffffffffffffc9c = *(FabArray<amrex::FArrayBox> **)local_38->vect;
              local_58.data = (BARef *)((long)&(in_stack_fffffffffffffc30->m_bat).m_op + 8);
              local_5c = 2;
              local_90 = (in_stack_fffffffffffffc30->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[2];
              for (in_stack_fffffffffffffc84 = in_stack_fffffffffffffcb0; iVar6 = iStack_a0,
                  (int)in_stack_fffffffffffffc84 <= (int)local_90;
                  in_stack_fffffffffffffc84 = in_stack_fffffffffffffc84 + ADD) {
                for (; BVar1 = local_a4, iVar6 <= iStack_7c; iVar6 = iVar6 + 1) {
                  while (in_stack_fffffffffffffc7c = BVar1,
                        (int)in_stack_fffffffffffffc7c <= local_80) {
                    local_68 = local_250;
                    *(undefined8 *)
                     (*local_250 +
                     ((long)(int)(in_stack_fffffffffffffc7c - (int)local_250[4]) +
                      (long)(iVar6 - *(int *)((long)local_250 + 0x24)) * local_250[1] +
                     (long)(int)(in_stack_fffffffffffffc84 - (int)local_250[5]) * local_250[2]) * 8)
                         = 0xbff0000000000000;
                    local_74 = in_stack_fffffffffffffc84;
                    local_70 = iVar6;
                    local_6c = in_stack_fffffffffffffc7c;
                    BVar1 = in_stack_fffffffffffffc7c + indexType;
                  }
                }
                in_stack_fffffffffffffc80 = iVar6;
              }
              in_stack_fffffffffffffc88 = in_stack_fffffffffffffc9c;
              local_33c._28_8_ = in_stack_fffffffffffffc30;
              local_c0._M_pi = in_stack_fffffffffffffca8;
              local_b8 = in_stack_fffffffffffffcb0;
              local_b0._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_stack_fffffffffffffc30;
              local_9c = in_stack_fffffffffffffcb0;
              local_98 = in_stack_fffffffffffffc9c;
              local_88 = in_stack_fffffffffffffc30;
              local_78 = local_90;
              local_28 = in_stack_fffffffffffffc30;
              local_18 = in_stack_fffffffffffffc30;
              local_8 = in_stack_fffffffffffffc30;
              __gnu_cxx::
              __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
              ::operator++((__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                            *)(local_33c + 0x34));
            }
            __gnu_cxx::
            __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
            ::operator++(&local_2c8);
          }
          MFIter::operator++(&local_248);
        }
        MFIter::~MFIter((MFIter *)in_stack_fffffffffffffc20);
        std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
        ~vector((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
                in_stack_fffffffffffffc30);
        BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffffc20);
        std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~vector
                  ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                   in_stack_fffffffffffffc30);
      }
    }
  }
  return;
}

Assistant:

void
Level::fillEdgeCent (Array<MultiFab*,AMREX_SPACEDIM> const& a_edgecent, const Geometry& geom) const
{
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        a_edgecent[idim]->setVal(1.0);
    }
    if (!isAllRegular()) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            auto& edgecent = *a_edgecent[idim];
            a_edgecent[idim]->ParallelCopy(m_edgecent[idim],0,0,edgecent.nComp(),
                                           0,edgecent.nGrow(),geom.periodicity());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            if (!m_covered_grids.empty())
            {
                const std::vector<IntVect>& pshifts = geom.periodicity().shiftIntVect();
                BoxArray const& covered_edge_grids = amrex::convert(m_covered_grids,
                                                                    edgecent.ixType());
                std::vector<std::pair<int,Box> > isects;
                for (MFIter mfi(edgecent); mfi.isValid(); ++mfi)
                {
                    auto const& fab = edgecent.array(mfi);
                    const Box& bx = mfi.fabbox();
                    for (const auto& iv : pshifts)
                    {
                        covered_edge_grids.intersections(bx+iv, isects);
                        for (const auto& is : isects) {
                            Box const& ibox = is.second-iv;
                            AMREX_HOST_DEVICE_PARALLEL_FOR_3D(ibox, i, j, k,
                            {
                                fab(i,j,k) = Real(-1.0);  // covered edges
                            });
                        }
                    }
                }
            }
        }
    }
}